

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset_container_unit.c
# Opt level: O0

void select_test(void)

{
  bitset_container_t *bitset;
  uint16_t value_1;
  uint32_t start_rank;
  uint32_t element;
  uint32_t i;
  uint16_t value;
  uint16_t base;
  bitset_container_t *B;
  bitset_container_t *in_stack_00000028;
  int in_stack_ffffffffffffffdc;
  undefined6 in_stack_ffffffffffffffe0;
  undefined2 in_stack_ffffffffffffffe6;
  undefined4 in_stack_ffffffffffffffe8;
  undefined4 uVar1;
  undefined4 in_stack_ffffffffffffffec;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffff0;
  int iVar3;
  undefined2 in_stack_fffffffffffffff4;
  ushort pos;
  undefined2 in_stack_fffffffffffffff6;
  ushort uVar4;
  ushort uVar5;
  
  bitset = bitset_container_create();
  _assert_true(CONCAT26(in_stack_fffffffffffffff6,
                        CONCAT24(in_stack_fffffffffffffff4,in_stack_fffffffffffffff0)),
               (char *)CONCAT44(in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8),
               (char *)CONCAT26(in_stack_ffffffffffffffe6,in_stack_ffffffffffffffe0),
               in_stack_ffffffffffffffdc);
  uVar4 = 0x1b;
  for (pos = 0x1b; (uint)pos < uVar4 + 200; pos = pos + 5) {
    bitset_container_add(bitset,pos);
  }
  iVar3 = 0;
  uVar2 = 0;
  uVar5 = uVar4;
  for (; (uint)uVar4 < uVar5 + 200; uVar4 = uVar4 + 5) {
    uVar1 = 0xc;
    bitset_container_select(in_stack_00000028,(uint32_t *)B,_value,_start_rank);
    _assert_true(CONCAT26(uVar5,CONCAT24(pos,iVar3)),(char *)CONCAT44(uVar2,uVar1),
                 (char *)CONCAT26(uVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    _assert_int_equal(CONCAT26(uVar5,CONCAT24(pos,iVar3)),CONCAT44(uVar2,uVar1),
                      (char *)CONCAT26(uVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
    iVar3 = iVar3 + 1;
  }
  uVar1 = 0xc;
  bitset_container_select(in_stack_00000028,(uint32_t *)B,_value,_start_rank);
  _assert_true(CONCAT26(uVar5,CONCAT24(pos,iVar3)),(char *)CONCAT44(uVar2,uVar1),
               (char *)CONCAT26(uVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  _assert_int_equal(CONCAT26(uVar5,CONCAT24(pos,iVar3)),CONCAT44(uVar2,uVar1),
                    (char *)CONCAT26(uVar4,in_stack_ffffffffffffffe0),in_stack_ffffffffffffffdc);
  bitset_container_free((bitset_container_t *)0x103b1a);
  return;
}

Assistant:

DEFINE_TEST(select_test) {
    bitset_container_t* B = bitset_container_create();
    assert_non_null(B);
    uint16_t base = 27;
    for (uint16_t value = base; value < base + 200; value += 5) {
        bitset_container_add(B, value);
    }
    uint32_t i = 0;
    uint32_t element = 0;
    uint32_t start_rank;
    for (uint16_t value = base; value < base + 200; value += 5) {
        start_rank = 12;
        assert_true(bitset_container_select(B, &start_rank, i + 12, &element));
        assert_int_equal(element, value);
        i++;
    }
    start_rank = 12;
    assert_false(bitset_container_select(B, &start_rank, i + 12, &element));
    assert_int_equal(start_rank, i + 12);
    bitset_container_free(B);
}